

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdfs_test.cpp
# Opt level: O3

void __thiscall Hair_WhiteFurnace_Test::TestBody(Hair_WhiteFurnace_Test *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ulong uVar6;
  long lVar7;
  char *in_R9;
  uint uVar8;
  int i;
  ulong uVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  float fVar12;
  Float FVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar17 [56];
  float beta_n;
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar22 [56];
  undefined4 in_XMM5_Da;
  undefined4 in_XMM5_Db;
  undefined8 in_XMM5_Qb;
  Vector3f wo;
  Vector3f wi;
  SampledSpectrum SVar23;
  SampledSpectrum f;
  SampledWavelengths lambda;
  HairBxDF hair;
  float local_114;
  undefined1 local_108 [16];
  SampledSpectrum local_f8;
  float local_e0;
  float local_dc;
  float local_d8;
  float local_d4;
  float local_d0;
  float local_cc;
  SampledSpectrum local_c8;
  undefined1 local_b8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0 [3];
  undefined1 local_98 [16];
  char *local_80 [2];
  long local_70 [8];
  undefined1 auVar16 [64];
  undefined1 auVar21 [64];
  
  local_d4 = 0.5;
  local_d8 = 0.33333334;
  local_dc = 0.2;
  local_e0 = 0.14285715;
  local_114 = 0.1;
  do {
    beta_n = 0.1;
    do {
      fVar12 = 0.0;
      uVar8 = 20000;
      if (beta_n < 0.5) {
        uVar8 = 100000;
      }
      if (local_114 < 0.5) {
        uVar8 = 100000;
      }
      uVar9 = 0;
      do {
        local_cc = fVar12;
        if (uVar9 == 0) {
          pbrt::SampledWavelengths::SampleXYZ((SampledWavelengths *)local_b8,0.0);
          auVar15 = ZEXT816(0) << 0x40;
        }
        else {
          fVar12 = 1.0;
          lVar7 = 0;
          uVar6 = uVar9;
          do {
            fVar12 = local_d4 * fVar12;
            lVar7 = (lVar7 - uVar6 / 2) * 2 + uVar6;
            bVar10 = 1 < uVar6;
            uVar6 = uVar6 / 2;
          } while (bVar10);
          auVar15._4_4_ = in_XMM5_Db;
          auVar15._0_4_ = in_XMM5_Da;
          auVar15._8_8_ = in_XMM5_Qb;
          auVar15 = vcvtusi2ss_avx512f(auVar15,lVar7);
          auVar15 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),
                               ZEXT416((uint)(fVar12 * auVar15._0_4_)));
          pbrt::SampledWavelengths::SampleXYZ((SampledWavelengths *)local_b8,auVar15._0_4_);
          fVar12 = 1.0;
          lVar7 = 0;
          uVar6 = uVar9;
          do {
            fVar12 = local_d8 * fVar12;
            lVar7 = (lVar7 - uVar6 / 3) * 3 + uVar6;
            bVar10 = 2 < uVar6;
            uVar6 = uVar6 / 3;
          } while (bVar10);
          auVar11._4_4_ = in_XMM5_Db;
          auVar11._0_4_ = in_XMM5_Da;
          auVar11._8_8_ = in_XMM5_Qb;
          auVar15 = vcvtusi2ss_avx512f(auVar11,lVar7);
          auVar15 = ZEXT416((uint)(fVar12 * auVar15._0_4_));
        }
        auVar15 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),auVar15);
        auVar14._0_8_ = (double)auVar15._0_4_;
        auVar14._8_8_ = auVar15._8_8_;
        auVar15 = vfmadd132sd_fma(auVar14,ZEXT816(0xbff0000000000000),ZEXT816(0x4000000000000000));
        uVar2 = vcmpsd_avx512f(auVar15,ZEXT816(0xbfeffffde7210be9),1);
        bVar10 = (bool)((byte)uVar2 & 1);
        auVar15 = vminsd_avx(ZEXT816(0x3feffffde7210be9),auVar15);
        local_f8.values.values = (array<float,_4>)(ZEXT416(0) << 0x40);
        local_108 = ZEXT816(0) << 0x20;
        pbrt::HairBxDF::HairBxDF
                  ((HairBxDF *)local_80,
                   (float)(double)((ulong)bVar10 * -0x4010000218def417 +
                                  (ulong)!bVar10 * auVar15._0_8_),1.55,&local_f8,local_114,beta_n,
                   0.0);
        auVar11 = SUB6416(ZEXT464(0x3f7fffff),0);
        auVar15 = ZEXT816(0) << 0x40;
        if (uVar9 != 0) {
          fVar12 = 1.0;
          lVar7 = 0;
          uVar6 = uVar9;
          do {
            fVar12 = local_dc * fVar12;
            lVar7 = (lVar7 - uVar6 / 5) * 5 + uVar6;
            bVar10 = 4 < uVar6;
            uVar6 = uVar6 / 5;
          } while (bVar10);
          auVar4._4_4_ = in_XMM5_Db;
          auVar4._0_4_ = in_XMM5_Da;
          auVar4._8_8_ = in_XMM5_Qb;
          auVar15 = vcvtusi2ss_avx512f(auVar4,lVar7);
          lVar7 = 0;
          fVar18 = 1.0;
          uVar6 = uVar9;
          do {
            fVar18 = local_e0 * fVar18;
            lVar7 = (lVar7 - uVar6 / 7) * 7 + uVar6;
            bVar10 = 6 < uVar6;
            uVar6 = uVar6 / 7;
          } while (bVar10);
          auVar11 = SUB6416(ZEXT464(0x3f7fffff),0);
          local_108 = vminss_avx(auVar11,ZEXT416((uint)(fVar12 * auVar15._0_4_)));
          auVar5._4_4_ = in_XMM5_Db;
          auVar5._0_4_ = in_XMM5_Da;
          auVar5._8_8_ = in_XMM5_Qb;
          auVar15 = vcvtusi2ss_avx512f(auVar5,lVar7);
          auVar15 = ZEXT416((uint)(fVar18 * auVar15._0_4_));
        }
        auVar11 = vminss_avx(auVar11,auVar15);
        auVar14 = vfmadd132ss_fma(local_108,SUB6416(ZEXT464(0x3f800000),0),ZEXT416(0xc0000000));
        auVar15 = vfnmadd213ss_fma(auVar14,auVar14,SUB6416(ZEXT464(0x3f800000),0));
        auVar15 = vmaxss_avx(auVar15,ZEXT416(0));
        auVar15 = vsqrtss_avx(auVar15,auVar15);
        local_d0 = auVar11._0_4_ * 6.2831855;
        fVar12 = cosf(local_d0);
        local_98 = ZEXT416((uint)(fVar12 * auVar15._0_4_));
        fVar12 = sinf(local_d0);
        local_108._0_4_ = auVar14._0_4_;
        auVar15 = vinsertps_avx(local_98,ZEXT416((uint)(fVar12 * auVar15._0_4_)),0x10);
        wo.super_Tuple3<pbrt::Vector3,_float>.z = 0.83457476;
        wo.super_Tuple3<pbrt::Vector3,_float>.x = 0.54986966;
        wo.super_Tuple3<pbrt::Vector3,_float>.y = 0.03359017;
        auVar22 = SUB6456(ZEXT6064((undefined1  [60])0x0),4);
        auVar17 = ZEXT856(0);
        wi.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar15._0_8_;
        wi.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_108._0_4_;
        SVar23 = pbrt::HairBxDF::f((HairBxDF *)local_80,wo,wi,Radiance);
        auVar21._0_8_ = SVar23.values.values._8_8_;
        auVar21._8_56_ = auVar22;
        auVar16._0_8_ = SVar23.values.values._0_8_;
        auVar16._8_56_ = auVar17;
        auVar15 = vmovlhps_avx(auVar16._0_16_,auVar21._0_16_);
        auVar19._4_4_ = local_108._0_4_;
        auVar19._0_4_ = local_108._0_4_;
        auVar19._8_4_ = local_108._0_4_;
        auVar19._12_4_ = local_108._0_4_;
        auVar3._8_4_ = 0x7fffffff;
        auVar3._0_8_ = 0x7fffffff7fffffff;
        auVar3._12_4_ = 0x7fffffff;
        auVar11 = vandps_avx512vl(auVar19,auVar3);
        local_c8.values.values[0] = auVar11._0_4_ * auVar15._0_4_;
        local_c8.values.values[1] = auVar11._4_4_ * auVar15._4_4_;
        local_c8.values.values[2] = auVar11._8_4_ * auVar15._8_4_;
        local_c8.values.values[3] = auVar11._12_4_ * auVar15._12_4_;
        FVar13 = pbrt::SampledSpectrum::y(&local_c8,(SampledWavelengths *)local_b8);
        uVar9 = uVar9 + 1;
        fVar12 = local_cc + FVar13;
      } while (uVar9 != uVar8);
      auVar20._0_8_ = (double)(fVar12 / ((float)uVar8 * 0.07957747));
      auVar20._8_8_ = 0;
      uVar2 = vcmppd_avx512vl(ZEXT816(0x3fee666666666666),auVar20,2);
      uVar1 = vcmppd_avx512vl(auVar20,ZEXT816(0x3ff0cccccccccccd),2);
      local_b8[0] = (internal)((byte)uVar2 & 3 & (byte)uVar1 & 1);
      local_b0[0].ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (local_b8[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_f8);
        std::ostream::_M_insert<double>(auVar20._0_8_);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_80,(internal *)local_b8,
                   (AssertionResult *)"avg >= .95 && avg <= 1.05","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_c8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/bsdfs_test.cpp"
                   ,0x2a3,local_80[0]);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)&local_f8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
        if ((float *)local_80[0] != (float *)((long)&((HairBxDF *)local_80)->sigma_a + 4U)) {
          operator_delete(local_80[0],local_70[0] + 1);
        }
        if (local_f8.values.values._0_8_ != 0) {
          bVar10 = testing::internal::IsTrue(true);
          if ((bVar10) && ((long *)local_f8.values.values._0_8_ != (long *)0x0)) {
            (**(code **)(*(long *)local_f8.values.values._0_8_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(local_b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      beta_n = beta_n + 0.2;
    } while (beta_n < 1.0);
    local_114 = local_114 + 0.2;
  } while (local_114 < 1.0);
  return;
}

Assistant:

TEST(Hair, WhiteFurnace) {
    RNG rng;
    Vector3f wo = SampleUniformSphere({rng.Uniform<Float>(), rng.Uniform<Float>()});
    for (Float beta_m = .1; beta_m < 1; beta_m += .2) {
        for (Float beta_n = .1; beta_n < 1; beta_n += .2) {
            // Estimate reflected uniform incident radiance from hair
            Float ySum = 0;

            // More samples for the smooth case, since we're sampling blindly.
            int count = (beta_m < .5 || beta_n < .5) ? 100000 : 20000;

            for (int i = 0; i < count; ++i) {
                SampledWavelengths lambda =
                    SampledWavelengths::SampleXYZ(RadicalInverse(0, i));

                Float h = Clamp(-1 + 2. * RadicalInverse(1, i), -.999999, .999999);
                SampledSpectrum sigma_a(0.f);
                HairBxDF hair(h, 1.55, sigma_a, beta_m, beta_n, 0.f);
                Vector3f wi =
                    SampleUniformSphere({RadicalInverse(2, i), RadicalInverse(3, i)});

                SampledSpectrum f =
                    hair.f(wo, wi, TransportMode::Radiance) * AbsCosTheta(wi);
                ySum += f.y(lambda);
            }

            Float avg = ySum / (count * UniformSpherePDF());
            EXPECT_TRUE(avg >= .95 && avg <= 1.05) << avg;
        }
    }
}